

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot_light.h
# Opt level: O2

void __thiscall
CMU462::DynamicScene::SpotLight::SpotLight
          (SpotLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  double dVar1;
  double dVar2;
  float fVar3;
  double local_98;
  double dStack_90;
  double local_88;
  Vector4D local_78;
  Vector4D local_50;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_get_static_light_002813c8;
  (this->spectrum).r = 0.0;
  (this->spectrum).g = 0.0;
  (this->spectrum).b = 0.0;
  (this->direction).x = 0.0;
  (this->direction).y = 0.0;
  (this->direction).z = 0.0;
  (this->position).x = 0.0;
  (this->position).y = 0.0;
  (this->position).z = 0.0;
  (this->spectrum).b = (light_info->spectrum).b;
  fVar3 = (light_info->spectrum).g;
  (this->spectrum).r = (light_info->spectrum).r;
  (this->spectrum).g = fVar3;
  local_78.x = (light_info->position).x;
  local_78.y = (light_info->position).y;
  local_78.z = (light_info->position).z;
  local_78.w = 1.0;
  Matrix4x4::operator*(transform,&local_78);
  Vector4D::to3D(&local_50);
  (this->position).z = local_88;
  (this->position).x = local_98;
  (this->position).y = dStack_90;
  local_78.x = (light_info->direction).x;
  local_78.y = (light_info->direction).y;
  local_78.z = (light_info->direction).z;
  local_78.w = 1.0;
  Matrix4x4::operator*(transform,&local_78);
  Vector4D::to3D(&local_50);
  dVar1 = (this->position).z;
  dVar2 = (this->position).y;
  (this->direction).x = local_98 - (this->position).x;
  (this->direction).y = dStack_90 - dVar2;
  (this->direction).z = local_88 - dVar1;
  Vector3D::normalize(&this->direction);
  return;
}

Assistant:

SpotLight(const Collada::LightInfo& light_info, const Matrix4x4& transform) {
    this->spectrum = light_info.spectrum;
    this->position = (transform * Vector4D(light_info.position, 1)).to3D();
    this->direction =
        (transform * Vector4D(light_info.direction, 1)).to3D() - position;
    this->direction.normalize();
  }